

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O1

long __thiscall Am_Value::operator_cast_to_long(Am_Value *this)

{
  Am_Wrapper *pAVar1;
  double dVar2;
  
  switch(this->type) {
  case 1:
    pAVar1 = (Am_Wrapper *)0x0;
    break;
  case 2:
  case 3:
    pAVar1 = (this->value).wrapper_value;
    break;
  case 4:
    pAVar1 = (Am_Wrapper *)(ulong)(this->value).bool_value;
    break;
  case 5:
    pAVar1 = (Am_Wrapper *)(long)(this->value).float_value;
    break;
  default:
    if (this->type != 0x8006) {
      type_error("long",this);
    }
    dVar2 = Am_Double_Data::operator_cast_to_double((Am_Double_Data *)(this->value).wrapper_value);
    pAVar1 = (Am_Wrapper *)(long)dVar2;
  }
  return (long)pAVar1;
}

Assistant:

Am_Value::operator long() const
{
  switch (type) {
  case Am_LONG:
  case Am_INT:
    return value.long_value;
  case Am_FLOAT:
    return (long)value.float_value;
  case Am_DOUBLE:
    return (long)(double)*(Am_Double_Data *)value.wrapper_value;
  case Am_BOOL:
    if (value.bool_value)
      return 1L;
    else
      return 0L;
  case Am_ZERO:
    return 0;
  default:
    type_error("long", *this);
    return 0L;
  }
}